

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
args::EitherFlag::str
          (string *__return_storage_ptr__,EitherFlag *this,string *shortPrefix,string *longPrefix)

{
  char cVar1;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *longPrefix_local;
  string *shortPrefix_local;
  EitherFlag *this_local;
  
  local_28 = longPrefix;
  longPrefix_local = shortPrefix;
  shortPrefix_local = (string *)this;
  this_local = (EitherFlag *)__return_storage_ptr__;
  if ((this->isShort & 1U) == 0) {
    std::operator+(__return_storage_ptr__,longPrefix,&this->longFlag);
  }
  else {
    cVar1 = this->shortFlag;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,1,cVar1,&local_49);
    std::operator+(__return_storage_ptr__,shortPrefix,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str(const std::string &shortPrefix, const std::string &longPrefix) const
        {
            return isShort ? shortPrefix + std::string(1, shortFlag) : longPrefix + longFlag;
        }